

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

string * ShellEscape(string *__return_storage_ptr__,string *arg)

{
  long in_FS_OFFSET;
  string escaped;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)&local_30,arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\'",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\'\"\'\"\'",&local_72);
  util::ReplaceAll(&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,"\'",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"\'");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ShellEscape(const std::string& arg)
{
    std::string escaped = arg;
    ReplaceAll(escaped, "'", "'\"'\"'");
    return "'" + escaped + "'";
}